

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

void __thiscall ent::base::base(base *this,uint32_t id,ByteVector *data)

{
  pointer puVar1;
  pointer puVar2;
  
  *(undefined2 *)&(this->super_MemoryReader).super_ReadWriter._readonly = 0;
  (this->super_MemoryReader)._mem = (uint8_t *)0x0;
  (this->super_MemoryReader)._size = 0;
  (this->super_MemoryReader)._curpos = 0;
  (this->super_MemoryReader).super_ReadWriter._vptr_ReadWriter = (_func_int **)&PTR__base_00139630;
  this->_id = id;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_data,data);
  puVar1 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_MemoryReader)._mem = puVar1;
  (this->super_MemoryReader)._size = (long)puVar2 - (long)puVar1;
  return;
}

Assistant:

base(uint32_t id, const ByteVector& data)
        : _id(id), _data(data)
    {
        setbuf(&_data.front(), _data.size());
    }